

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armformatter.cpp
# Opt level: O2

Error asmjit::v1_14::arm::FormatterInternal::formatRegister
                (String *sb,FormatFlags flags,BaseEmitter *emitter,Arch arch,RegType regType,
                uint32_t rId,uint32_t elementType,uint32_t elementIndex)

{
  byte bVar1;
  char cVar2;
  Error EVar3;
  VirtReg *pVVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  size_t sStack_30;
  
  uVar8 = rId - 0x100;
  if (((emitter == (BaseEmitter *)0x0 || 0xfffffefe < uVar8) || (emitter->_emitterType != kCompiler)
      ) || (*(uint *)&emitter[3]._errorHandler <= uVar8)) {
    uVar5 = (ulong)regType;
    uVar8 = (uint)regType;
    uVar6 = uVar8 - 8;
    if (uVar6 < 5) {
      cVar2 = 'v';
      if (elementType == 0) {
        if (uVar6 == 5) goto LAB_00127cfa;
        cVar2 = "bhsdq"[uVar6];
      }
LAB_00127c69:
      uVar5 = (ulong)(uint)(int)cVar2;
      pcVar7 = "%c%u";
    }
    else {
      if (uVar8 == 6) {
        cVar2 = 'r';
        if ((arch & k32BitMask) == kUnknown) {
          if (rId == 0x1f) {
            pcVar7 = "wsp";
          }
          else {
            cVar2 = 'w';
            if (rId != 0x3f) goto LAB_00127c69;
            pcVar7 = "wzr";
          }
LAB_00127d6b:
          sStack_30 = 3;
LAB_00127d7e:
          EVar3 = String::_opString(sb,kAppend,pcVar7,sStack_30);
          return EVar3;
        }
        goto LAB_00127c69;
      }
      if ((uVar8 == 7) && ((arch & k32BitMask) == kUnknown)) {
        if (rId == 0x1f) {
          pcVar7 = "sp";
          sStack_30 = 2;
          goto LAB_00127d7e;
        }
        cVar2 = 'x';
        if (rId == 0x3f) {
          pcVar7 = "xzr";
          goto LAB_00127d6b;
        }
        goto LAB_00127c69;
      }
      pcVar7 = "<Reg-%u>?%u";
    }
    EVar3 = String::_opFormat(sb,kAppend,pcVar7,uVar5);
  }
  else {
    pVVar4 = BaseCompiler::virtRegById((BaseCompiler *)emitter,rId);
    if (pVVar4 == (VirtReg *)0x0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/armformatter.cpp"
                 ,0x14e,"vReg != nullptr");
    }
    if (*(uint *)(pVVar4 + 0x18) < 0xc) {
      pVVar4 = pVVar4 + 0x1c;
    }
    else {
      pVVar4 = *(VirtReg **)(pVVar4 + 0x20);
    }
    if ((pVVar4 == (VirtReg *)0x0) || (*pVVar4 == (VirtReg)0x0)) {
      EVar3 = String::_opFormat(sb,kAppend,"%%%u",(ulong)uVar8);
    }
    else {
      EVar3 = String::_opString(sb,kAppend,(char *)pVVar4,0xffffffffffffffff);
    }
  }
  if (EVar3 != 0) {
    return EVar3;
  }
  if (elementType != 0) {
    uVar5 = 7;
    if (elementType < 7) {
      uVar5 = (ulong)elementType;
    }
    cVar2 = formatElementDataTable[uVar5 * 4];
    bVar1 = (byte)formatElementDataTable[uVar5 * 4 + 1] >> (regType == kARM_VecD);
    EVar3 = String::_opChar(sb,kAppend,'.');
    if (EVar3 != 0) {
      return EVar3;
    }
    if ((bVar1 != 0) && (EVar3 = String::_opNumber(sb,kAppend,(ulong)bVar1,0,0,kNone), EVar3 != 0))
    {
      return EVar3;
    }
    EVar3 = String::_opChar(sb,kAppend,cVar2);
    if (EVar3 != 0) {
      return EVar3;
    }
  }
LAB_00127cfa:
  if ((elementIndex != 0xffffffff) &&
     (EVar3 = String::_opFormat(sb,kAppend,"[%u]",(ulong)elementIndex), EVar3 != 0)) {
    return EVar3;
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatRegister(
  String& sb,
  FormatFlags flags,
  const BaseEmitter* emitter,
  Arch arch,
  RegType regType,
  uint32_t rId,
  uint32_t elementType,
  uint32_t elementIndex) noexcept {

  DebugUtils::unused(flags);
  DebugUtils::unused(arch);

  static const char bhsdq[] = "bhsdq";

  bool virtRegFormatted = false;

#ifndef ASMJIT_NO_COMPILER
  if (Operand::isVirtId(rId)) {
    if (emitter && emitter->isCompiler()) {
      const BaseCompiler* cc = static_cast<const BaseCompiler*>(emitter);
      if (cc->isVirtIdValid(rId)) {
        VirtReg* vReg = cc->virtRegById(rId);
        ASMJIT_ASSERT(vReg != nullptr);

        const char* name = vReg->name();
        if (name && name[0] != '\0')
          ASMJIT_PROPAGATE(sb.append(name));
        else
          ASMJIT_PROPAGATE(sb.appendFormat("%%%u", unsigned(Operand::virtIdToIndex(rId))));

        virtRegFormatted = true;
      }
    }
  }
#else
  DebugUtils::unused(emitter, flags);
#endif

  if (!virtRegFormatted) {
    char letter = '\0';
    switch (regType) {
      case RegType::kARM_VecB:
      case RegType::kARM_VecH:
      case RegType::kARM_VecS:
      case RegType::kARM_VecD:
      case RegType::kARM_VecV:
        letter = bhsdq[uint32_t(regType) - uint32_t(RegType::kARM_VecB)];
        if (elementType)
          letter = 'v';
        break;

      case RegType::kARM_GpW:
        if (Environment::is64Bit(arch)) {
          letter = 'w';

          if (rId == a64::Gp::kIdZr)
            return sb.append("wzr", 3);

          if (rId == a64::Gp::kIdSp)
            return sb.append("wsp", 3);
        }
        else {
          letter = 'r';
        }
        break;

      case RegType::kARM_GpX:
        if (Environment::is64Bit(arch)) {
          if (rId == a64::Gp::kIdZr)
            return sb.append("xzr", 3);
          if (rId == a64::Gp::kIdSp)
            return sb.append("sp", 2);

          letter = 'x';
          break;
        }

        // X registers are undefined in 32-bit mode.
        ASMJIT_FALLTHROUGH;

      default:
        ASMJIT_PROPAGATE(sb.appendFormat("<Reg-%u>?%u", uint32_t(regType), rId));
        break;
    }

    if (letter)
      ASMJIT_PROPAGATE(sb.appendFormat("%c%u", letter, rId));
  }

  constexpr uint32_t kElementTypeCount = uint32_t(a64::VecElementType::kMaxValue) + 1;
  if (elementType) {
    elementType = Support::min(elementType, kElementTypeCount);

    FormatElementData elementData = formatElementDataTable[elementType];
    uint32_t elementCount = elementData.elementCount;

    if (regType == RegType::kARM_VecD) {
      elementCount /= 2u;
    }

    ASMJIT_PROPAGATE(sb.append('.'));
    if (elementCount) {
      ASMJIT_PROPAGATE(sb.appendUInt(elementCount));
    }
    ASMJIT_PROPAGATE(sb.append(elementData.letter));
  }

  if (elementIndex != 0xFFFFFFFFu) {
    ASMJIT_PROPAGATE(sb.appendFormat("[%u]", elementIndex));
  }

  return kErrorOk;
}